

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall pstack::JSONEncodingError::~JSONEncodingError(JSONEncodingError *this)

{
  JSONEncodingError *this_local;
  
  ~JSONEncodingError(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

JSONEncodingError(std::string &&rhs) : msg(std::move(rhs)) {}